

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_0xxx_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  switch(*quads) {
  case 2:
    sh4asm_disas_0xx2_(quads,em,pc);
    break;
  case 3:
    sh4asm_disas_0xx3_(quads,em,pc);
    break;
  case 4:
    sh4asm_disas_0xx4_(quads,em,pc);
    break;
  case 5:
    sh4asm_disas_0xx5_(quads,em,pc);
    break;
  case 6:
    sh4asm_disas_0xx6_(quads,em,pc);
    break;
  case 7:
    sh4asm_disas_0xx7_(quads,em,pc);
    break;
  case 8:
    sh4asm_disas_0xx8_(quads,em,pc);
    break;
  case 9:
    sh4asm_disas_0xx9_(quads,em,pc);
    break;
  case 10:
    sh4asm_disas_0xxa_(quads,em,pc);
    break;
  case 0xb:
    sh4asm_disas_0xxb_(quads,em,pc);
    break;
  case 0xc:
    sh4asm_disas_0xxc_(quads,em,pc);
    break;
  case 0xd:
    sh4asm_disas_0xxd_(quads,em,pc);
    break;
  case 0xe:
    sh4asm_disas_0xxe_(quads,em,pc);
    break;
  case 0xf:
    sh4asm_disas_0xxf_(quads,em,pc);
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
  }
  return;
}

Assistant:

static void sh4asm_disas_0xxx_(unsigned const *quads,
                               sh4asm_disas_emit_func em, uint32_t pc) {
    switch (quads[0]) {
    case 2:
        sh4asm_disas_0xx2_(quads, em, pc);
        break;
    case 3:
        sh4asm_disas_0xx3_(quads, em, pc);
        break;
    case 4:
        sh4asm_disas_0xx4_(quads, em, pc);
        break;
    case 5:
        sh4asm_disas_0xx5_(quads, em, pc);
        break;
    case 6:
        sh4asm_disas_0xx6_(quads, em, pc);
        break;
    case 7:
        sh4asm_disas_0xx7_(quads, em, pc);
        break;
    case 8:
        sh4asm_disas_0xx8_(quads, em, pc);
        break;
    case 9:
        sh4asm_disas_0xx9_(quads, em, pc);
        break;
    case 10:
        sh4asm_disas_0xxa_(quads, em, pc);
        break;
    case 11:
        sh4asm_disas_0xxb_(quads, em, pc);
        break;
    case 12:
        sh4asm_disas_0xxc_(quads, em, pc);
        break;
    case 13:
        sh4asm_disas_0xxd_(quads, em, pc);
        break;
    case 14:
        sh4asm_disas_0xxe_(quads, em, pc);
        break;
    case 15:
        sh4asm_disas_0xxf_(quads, em, pc);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}